

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-type-util.h
# Opt level: O0

String testing::internal::GetTypeName<double>(void)

{
  void *__ptr;
  size_t extraout_RDX;
  String *in_RDI;
  String SVar1;
  char *readable_name;
  int status;
  char *name;
  String *name_str;
  String *this;
  int local_14;
  char *local_10;
  
  this = in_RDI;
  local_10 = std::type_info::name((type_info *)&double::typeinfo);
  local_14 = 0;
  __ptr = (void *)__cxa_demangle(local_10,0,0,&local_14);
  String::String(this,(char *)in_RDI);
  free(__ptr);
  SVar1.length_ = extraout_RDX;
  SVar1.c_str_ = (char *)this;
  return SVar1;
}

Assistant:

String GetTypeName() {
# if GTEST_HAS_RTTI

  const char* const name = typeid(T).name();
#  if defined(__GLIBCXX__) || defined(__HP_aCC)
  int status = 0;
  // gcc's implementation of typeid(T).name() mangles the type name,
  // so we have to demangle it.
#   ifdef __GLIBCXX__
  using abi::__cxa_demangle;
#   endif // __GLIBCXX__
  char* const readable_name = __cxa_demangle(name, 0, 0, &status);
  const String name_str(status == 0 ? readable_name : name);
  free(readable_name);
  return name_str;
#  else
  return name;
#  endif  // __GLIBCXX__ || __HP_aCC

# else

  return "<type>";

# endif  // GTEST_HAS_RTTI
}